

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall Js::FunctionProxy::HasValidEntryPoint(FunctionProxy *this)

{
  bool bVar1;
  BOOL BVar2;
  bool local_21;
  FunctionProxy *this_local;
  
  bVar1 = IsWasmFunction(this);
  if ((bVar1) ||
     ((bVar1 = ScriptContext::HadProfiled(this->m_scriptContext), !bVar1 &&
      ((bVar1 = ScriptContext::IsScriptContextInDebugMode(this->m_scriptContext), !bVar1 ||
       (bVar1 = ScriptContext::IsExceptionWrapperForBuiltInsEnabled(this->m_scriptContext), !bVar1))
      )))) {
    this_local._7_1_ = HasValidNonProfileEntryPoint(this);
  }
  else {
    BVar2 = ScriptContext::IsProfiling(this->m_scriptContext);
    if (BVar2 == 0) {
      bVar1 = HasValidNonProfileEntryPoint(this);
      local_21 = true;
      if (!bVar1) {
        local_21 = HasValidProfileEntryPoint(this);
      }
      this_local._7_1_ = local_21;
    }
    else {
      this_local._7_1_ = HasValidProfileEntryPoint(this);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FunctionProxy::HasValidEntryPoint() const
    {
        if (this->IsWasmFunction() ||
            (!m_scriptContext->HadProfiled() &&
            !(this->m_scriptContext->IsScriptContextInDebugMode() && m_scriptContext->IsExceptionWrapperForBuiltInsEnabled())))
        {
            return this->HasValidNonProfileEntryPoint();
        }
#if defined(ENABLE_SCRIPT_PROFILING) || defined(ENABLE_SCRIPT_DEBUGGING)
        if (m_scriptContext->IsProfiling())
        {
            return this->HasValidProfileEntryPoint();
        }

        return this->HasValidNonProfileEntryPoint() || this->HasValidProfileEntryPoint();
#else
        return this->HasValidNonProfileEntryPoint();
#endif
    }